

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeLiteGenerator::GetDocumentation
          (cmExtraCodeLiteGenerator *this,cmDocumentationEntry *entry,string *param_2)

{
  long *local_30 [2];
  long local_20 [2];
  
  (*(this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator[2])
            ((string *)local_30,this);
  std::__cxx11::string::operator=((string *)entry,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x520da8);
  return;
}

Assistant:

void cmExtraCodeLiteGenerator::GetDocumentation(cmDocumentationEntry& entry,
                                                const std::string&) const
{
  entry.Name = this->GetName();
  entry.Brief = "Generates CodeLite project files.";
}